

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

void __thiscall Js::CompoundString::Builder<256U>::AppendSlow(Builder<256U> *this,char16 c)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CompoundString *toString;
  JavascriptString *s;
  
  if (this->compoundString != (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x248,"(!this->compoundString)","!this->compoundString");
    if (!bVar2) goto LAB_00d2e1c6;
    *puVar3 = 0;
  }
  toString = CompoundString::New(this->stringLength,this->directCharLength,this,this->charLength,
                                 true,(this->scriptContext->super_ScriptContextBase).
                                      javascriptLibrary);
  this->compoundString = toString;
  if (this->directCharLength == 0xffffffff) {
    bVar2 = TryAppendGeneric<Js::CompoundString>(c,toString);
  }
  else {
    s = CharStringCache::GetStringForChar
                  (&((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                    charStringCache,c);
    bVar2 = TryAppendGeneric<Js::CompoundString>(s,1,toString);
  }
  if (bVar2 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x24f,"(appended)","appended");
    if (!bVar2) {
LAB_00d2e1c6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void CompoundString::Builder<MinimumCharCapacity>::AppendSlow(const char16 c)
    {
        Assert(!this->compoundString);
        CompoundString *const compoundString = CreateCompoundString(true);
        this->compoundString = compoundString;
        const bool appended =
            HasOnlyDirectChars()
                ? TryAppendGeneric(c, compoundString)
                : TryAppendGeneric(GetLibrary()->GetCharStringCache().GetStringForChar(c), 1, compoundString);
        Assert(appended);
    }